

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aead80pq_inplace.c
# Opt level: O0

void test_aead80pq_inplace(void)

{
  puts("Testing Ascon-80pq en/decryption in-place...");
  test_inplace_offline();
  test_inplace_update_single_byte();
  return;
}

Assistant:

void test_aead80pq_inplace(void)
{
    puts("Testing Ascon-80pq en/decryption in-place...");
    test_inplace_offline();
    test_inplace_update_single_byte();
}